

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<int,int,int,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseXOROperator,bool,true,false>
               (int *ldata,int *rdata,int *result_data,idx_t count,ValidityMask *mask,bool fun)

{
  uint uVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  int lentry_1;
  ulong uVar4;
  idx_t iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int lentry;
  
  puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar1 = *ldata;
      iVar5 = 0;
      do {
        result_data[iVar5] = rdata[iVar5] ^ uVar1;
        iVar5 = iVar5 + 1;
      } while (count != iVar5);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar8 = 0;
    uVar6 = 0;
    do {
      uVar3 = puVar2[uVar8];
      uVar4 = uVar6 + 0x40;
      if (count <= uVar6 + 0x40) {
        uVar4 = count;
      }
      uVar7 = uVar4;
      if (uVar3 != 0) {
        uVar7 = uVar6;
        if (uVar3 == 0xffffffffffffffff) {
          if (uVar6 < uVar4) {
            uVar1 = *ldata;
            do {
              result_data[uVar7] = rdata[uVar7] ^ uVar1;
              uVar7 = uVar7 + 1;
            } while (uVar4 != uVar7);
          }
        }
        else if (uVar6 < uVar4) {
          uVar7 = 0;
          do {
            if ((uVar3 >> (uVar7 & 0x3f) & 1) != 0) {
              result_data[uVar6 + uVar7] = rdata[uVar6 + uVar7] ^ *ldata;
            }
            uVar7 = uVar7 + 1;
          } while ((uVar6 - uVar4) + uVar7 != 0);
          uVar7 = uVar6 + uVar7;
        }
      }
      uVar8 = uVar8 + 1;
      uVar6 = uVar7;
    } while (uVar8 != count + 0x3f >> 6);
    return;
  }
  return;
}

Assistant:

inline bool AllValid() const {
		return !validity_mask;
	}